

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O1

size_t Output::TraceWithFlush(Flag flag,char16 *form,...)

{
  char in_AL;
  bool bVar1;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list argptr;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  bVar1 = Js::ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)Js::Configuration::Global,flag);
  if (bVar1) {
    argptr[0].overflow_arg_area = local_e8;
    argptr[0]._0_8_ = &stack0x00000008;
    local_38._0_4_ = 0x10;
    local_38._4_4_ = 0x30;
    sVar2 = VTrace(L"[-%s]::",(char16 *)(&Js::FlagNames)[flag],form,(__va_list_tag *)local_38);
    Flush();
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t __cdecl
Output::TraceWithFlush(Js::Flag flag, const char16 *form, ...)
{
    size_t retValue = 0;

    if (Js::Configuration::Global.flags.IsEnabled(flag))
    {
        va_list argptr;
        va_start(argptr, form);
        retValue += Output::VTrace(_u("[-%s]::"), Js::FlagNames[static_cast<int>(flag)], form, argptr);
        Output::Flush();
        va_end(argptr);
    }

    return retValue;
}